

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O1

void __thiscall
PDFStream::PDFStream
          (PDFStream *this,bool inCompressStream,IByteWriterWithPosition *inOutputStream,
          EncryptionHelper *inEncryptionHelper,ObjectIDType inExtentObjectID,
          IObjectsContextExtender *inObjectsContextExtender)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  IByteWriterWithPosition *pIVar4;
  OutputFlateEncodeStream *this_00;
  
  this_00 = &this->mFlateEncodingStream;
  OutputFlateEncodeStream::OutputFlateEncodeStream(this_00);
  *(code **)&this->mTemporaryStream = __assert_fail;
  *(undefined8 *)&(this->mTemporaryStream).field_0x8 = 0;
  *(undefined8 *)&(this->mTemporaryStream).field_0x10 = 0;
  *(undefined8 *)&(this->mTemporaryStream).field_0x18 = 0;
  *(undefined8 *)&(this->mTemporaryStream).field_0x20 = 0;
  *(undefined8 *)&(this->mTemporaryStream).field_0x28 = 0;
  *(undefined8 *)&(this->mTemporaryStream).field_0x30 = 0;
  std::locale::locale((locale *)&(this->mTemporaryStream).field_0x38);
  *(undefined4 *)&(this->mTemporaryStream).field_0x40 = 0x18;
  *(undefined1 **)&(this->mTemporaryStream).field_0x48 = &(this->mTemporaryStream).field_0x58;
  *(undefined8 *)&(this->mTemporaryStream).field_0x50 = 0;
  (this->mTemporaryStream).field_0x58 = 0;
  *(undefined ***)&this->mTemporaryStream = &PTR__stringbuf_003abd78;
  OutputStringBufferStream::OutputStringBufferStream(&this->mTemporaryOutputStream);
  this->mExtender = inObjectsContextExtender;
  this->mCompressStream = inCompressStream;
  this->mExtendObjectID = inExtentObjectID;
  iVar3 = (*(inOutputStream->super_IByteWriter)._vptr_IByteWriter[3])(inOutputStream);
  this->mStreamStartPosition = CONCAT44(extraout_var,iVar3);
  this->mOutputStream = inOutputStream;
  if ((inEncryptionHelper == (EncryptionHelper *)0x0) ||
     (bVar1 = EncryptionHelper::IsEncrypting(inEncryptionHelper), !bVar1)) {
    pIVar4 = (IByteWriterWithPosition *)0x0;
  }
  else {
    pIVar4 = EncryptionHelper::CreateEncryptionStream(inEncryptionHelper,inOutputStream);
  }
  this->mEncryptionStream = pIVar4;
  this->mStreamLength = 0;
  this->mStreamDictionaryContextForDirectExtentStream = (DictionaryContext *)0x0;
  if (this->mCompressStream == true) {
    if ((this->mExtender == (IObjectsContextExtender *)0x0) ||
       (cVar2 = (**(code **)(*(long *)this->mExtender + 0x10))(), cVar2 == '\0')) {
      if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
        inOutputStream = this->mEncryptionStream;
      }
      OutputFlateEncodeStream::Assign(this_00,inOutputStream,true);
      inOutputStream = &this_00->super_IByteWriterWithPosition;
    }
    else {
      if (this->mEncryptionStream != (IByteWriterWithPosition *)0x0) {
        inOutputStream = this->mEncryptionStream;
      }
      inOutputStream =
           (IByteWriterWithPosition *)
           (**(code **)(*(long *)this->mExtender + 0x18))(this->mExtender,inOutputStream);
    }
  }
  else if ((OutputFlateEncodeStream *)this->mEncryptionStream != (OutputFlateEncodeStream *)0x0) {
    inOutputStream = this->mEncryptionStream;
  }
  this->mWriteStream = &inOutputStream->super_IByteWriter;
  return;
}

Assistant:

PDFStream::PDFStream(bool inCompressStream,
					 IByteWriterWithPosition* inOutputStream,
					 EncryptionHelper* inEncryptionHelper,
					 ObjectIDType inExtentObjectID,
					 IObjectsContextExtender* inObjectsContextExtender)
{
	mExtender = inObjectsContextExtender;
	mCompressStream = inCompressStream;
	mExtendObjectID = inExtentObjectID;	
	mStreamStartPosition = inOutputStream->GetCurrentPosition();
	mOutputStream = inOutputStream;
	if (inEncryptionHelper && inEncryptionHelper->IsEncrypting()) {
		mEncryptionStream = inEncryptionHelper->CreateEncryptionStream(inOutputStream);
	}
	else {
		mEncryptionStream = NULL;
	}

	mStreamLength = 0;
    mStreamDictionaryContextForDirectExtentStream = NULL;


	if(mCompressStream)
	{
		if(mExtender && mExtender->OverridesStreamCompression())
		{
			mWriteStream = mExtender->GetCompressionWriteStream(mEncryptionStream ? mEncryptionStream:inOutputStream);
		}
		else
		{
			mFlateEncodingStream.Assign(mEncryptionStream ? mEncryptionStream : inOutputStream);
			mWriteStream = &mFlateEncodingStream;
		}
	}
	else
		mWriteStream = mEncryptionStream ? mEncryptionStream : inOutputStream;

}